

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_263741::LogisimParser::add_pin_location
          (LogisimParser *this,Position *loc,pin_id_t start,size_t count)

{
  unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
  *this_00;
  Position PVar1;
  __node_ptr p_Var2;
  Position *pPVar3;
  size_t sVar4;
  LogisimConnection connection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_50;
  pin_id_t local_38;
  
  vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  PVar1 = *loc;
  if (count != 0) {
    sVar4 = count;
    do {
      local_38 = start;
      if (vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&vStack_50,
                   (iterator)
                   vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = start;
        vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      start = start + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  this_00 = &(this->m_context).m_pin_locs;
  p_Var2 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,
                          loc->m_full % (this->m_context).m_pin_locs._M_h._M_bucket_count,
                          &loc->m_full,count);
  if (p_Var2 == (__node_ptr)0x0) {
    pPVar3 = &std::
              unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
              ::operator[](this_00,&loc->m_full)->m_position;
    *pPVar3 = PVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pPVar3[1].field_0,
               &vStack_50);
  }
  if (vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_50.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_50.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LogisimParser::add_pin_location(const Position &loc, pin_id_t start, size_t count) {
    LogisimConnection connection;
    connection.m_position = loc;

    for (size_t i = 0; i < count; ++i) {
       connection.m_pins.push_back(start + i);
    }

    // connect if there is already a pin in the same location
    auto res = m_context.m_pin_locs.find(loc.m_full);
    if (res != m_context.m_pin_locs.end()) {
        // XXX make_connection(connection, res->second);
    } else {
       m_context.m_pin_locs[loc.m_full] = connection;
    }
}